

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O3

ScanStatus * __thiscall
Oric::VideoOutput::get_scaled_scan_status(ScanStatus *__return_storage_ptr__,VideoOutput *this)

{
  undefined1 auVar1 [16];
  undefined1 local_38 [16];
  double local_28;
  float local_20;
  int local_1c;
  bool local_18;
  
  Outputs::CRT::CRT::get_scaled_scan_status((ScanStatus *)local_38,&this->crt_);
  auVar1 = divpd(local_38,_DAT_004cca00);
  __return_storage_ptr__->field_duration = (Seconds)auVar1._0_8_;
  __return_storage_ptr__->field_duration_gradient = (Seconds)auVar1._8_8_;
  __return_storage_ptr__->retrace_duration = local_28 / 6.0;
  __return_storage_ptr__->current_position = local_20;
  __return_storage_ptr__->hsync_count = local_1c;
  __return_storage_ptr__->is_in_retrace = local_18;
  return __return_storage_ptr__;
}

Assistant:

Outputs::Display::ScanStatus VideoOutput::get_scaled_scan_status() const {
	return crt_.get_scaled_scan_status() / 6.0f;
}